

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

optional<long> __thiscall
anon_unknown.dwarf_29c3b1::PKHDescriptor::MaxSatisfactionWeight
          (PKHDescriptor *this,bool use_max_sig)

{
  long lVar1;
  undefined3 in_register_00000031;
  long in_FS_OFFSET;
  undefined1 auVar2 [16];
  optional<long> oVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  auVar2 = (**(code **)(*(long *)(((this->super_DescriptorImpl).m_pubkey_args.
                                   super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                 super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                                 ._M_t + 0x20))();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = auVar2._9_7_;
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = true;
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value =
         ((ulong)CONCAT31(in_register_00000031,use_max_sig) + auVar2._0_8_) * 4 + 0x124;
    return (optional<long>)
           oVar3.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> MaxSatisfactionWeight(bool use_max_sig) const override {
        return *MaxSatSize(use_max_sig) * WITNESS_SCALE_FACTOR;
    }